

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fReadPixelsTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles2::Functional::ReadPixelsTest::iterate(ReadPixelsTest *this)

{
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *pvVar1;
  int iVar2;
  ChannelOrder CVar3;
  ChannelType CVar4;
  TestLog *log;
  ChannelOrder CVar5;
  ChannelType CVar6;
  pointer dst;
  bool bVar7;
  GLenum GVar8;
  RenderTarget *pRVar9;
  byte bVar10;
  char *pcVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  GLint glType;
  GLint glFormat;
  TextureFormat format;
  int pixelSize;
  IVec4 formatBitDepths;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixelData;
  Random rnd;
  Texture2D resultRGBA8;
  Texture2D reference;
  PixelBufferAccess local_1d8;
  Texture2D referenceRGBA8;
  
  deRandom_init(&rnd.m_rnd,this->m_seed);
  format.order = RGBA;
  format.type = UNORM_INT8;
  getFormatInfo(this,&format,&glFormat,&glType,&pixelSize);
  referenceRGBA8.super_TextureLevelPyramid.m_format =
       (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pvVar1 = &referenceRGBA8.super_TextureLevelPyramid.m_data;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pvVar1);
  std::operator<<((ostream *)pvVar1,"Format: ");
  reference.super_TextureLevelPyramid.m_format = (TextureFormat)glu::getTextureFormatName;
  reference.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = glFormat;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&reference,(ostream *)pvVar1);
  std::operator<<((ostream *)pvVar1,", Type: ");
  resultRGBA8.super_TextureLevelPyramid.m_format = (TextureFormat)glu::getTypeName;
  resultRGBA8.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = glType;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&resultRGBA8,(ostream *)pvVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&referenceRGBA8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pvVar1);
  tcu::Texture2D::Texture2D(&reference,&format,0xd,0xd);
  tcu::Texture2D::allocLevel(&reference,0);
  glwViewport(0,0,0xd,0xd);
  GVar8 = glwGetError();
  glu::checkError(GVar8,"glViewport(0, 0, width, height)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                  ,0xbb);
  fVar13 = deRandom_getFloat(&rnd.m_rnd);
  fVar14 = deRandom_getFloat(&rnd.m_rnd);
  fVar15 = deRandom_getFloat(&rnd.m_rnd);
  referenceRGBA8.super_TextureLevelPyramid.m_format =
       (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pvVar1 = &referenceRGBA8.super_TextureLevelPyramid.m_data;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pvVar1);
  std::operator<<((ostream *)pvVar1,"Clear color: (");
  std::ostream::operator<<(pvVar1,fVar13);
  std::operator<<((ostream *)pvVar1,", ");
  std::ostream::operator<<(pvVar1,fVar14);
  std::operator<<((ostream *)pvVar1,", ");
  std::ostream::operator<<(pvVar1,fVar15);
  std::operator<<((ostream *)pvVar1,", ");
  std::ostream::operator<<(pvVar1,1.0);
  std::operator<<((ostream *)pvVar1,")");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&referenceRGBA8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pvVar1);
  glwClearColor(fVar13,fVar14,fVar15,1.0);
  GVar8 = glwGetError();
  glu::checkError(GVar8,"glClearColor(red, green, blue, alpha)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                  ,199);
  glwClear(0x4000);
  GVar8 = glwGetError();
  glu::checkError(GVar8,"glClear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                  ,200);
  referenceRGBA8.super_TextureLevelPyramid.m_format.type = (ChannelType)fVar14;
  referenceRGBA8.super_TextureLevelPyramid.m_format.order = (ChannelOrder)fVar13;
  referenceRGBA8.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0x3f800000;
  referenceRGBA8.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = fVar15;
  tcu::clear(reference.super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&referenceRGBA8);
  render(this,&reference);
  pixelData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pixelData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pixelData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar12 = this->m_alignment;
  fVar13 = ceilf((float)(pixelSize * 0xd) / (float)iVar12);
  iVar12 = (int)fVar13 * iVar12;
  referenceRGBA8.super_TextureLevelPyramid.m_format =
       (TextureFormat)
       ((ulong)referenceRGBA8.super_TextureLevelPyramid.m_format & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&pixelData,(long)(iVar12 * 0xd),(value_type_conflict5 *)&referenceRGBA8);
  glwPixelStorei(0xd05,this->m_alignment);
  GVar8 = glwGetError();
  glu::checkError(GVar8,"glPixelStorei(GL_PACK_ALIGNMENT, m_alignment)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                  ,0xd4);
  glwReadPixels(0,0,0xd,0xd,glFormat,glType,
                pixelData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start);
  GVar8 = glwGetError();
  glu::checkError(GVar8,"glReadPixels(0, 0, width, height, glFormat, glType, &(pixelData[0]))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                  ,0xd5);
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar9->m_numSamples < 2) {
    tcu::getTextureFormatBitDepth((tcu *)&resultRGBA8,&format);
    pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
    CVar3 = (pRVar9->m_pixelFormat).redBits;
    CVar5 = resultRGBA8.super_TextureLevelPyramid.m_format.order;
    if ((int)CVar3 < (int)resultRGBA8.super_TextureLevelPyramid.m_format.order) {
      CVar5 = CVar3;
    }
    pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
    CVar4 = (pRVar9->m_pixelFormat).greenBits;
    CVar6 = resultRGBA8.super_TextureLevelPyramid.m_format.type;
    if ((int)CVar4 < (int)resultRGBA8.super_TextureLevelPyramid.m_format.type) {
      CVar6 = CVar4;
    }
    pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar2 = (pRVar9->m_pixelFormat).blueBits;
    bVar10 = (byte)(GLint)resultRGBA8.super_TextureLevelPyramid.m_data.
                          super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
    if (iVar2 < (GLint)resultRGBA8.super_TextureLevelPyramid.m_data.
                       super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) {
      bVar10 = (byte)iVar2;
    }
    pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar2 = (pRVar9->m_pixelFormat).alphaBits;
    log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&referenceRGBA8,&format,0xd,0xd,1,iVar12,0,
               pixelData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (iVar2 < resultRGBA8.super_TextureLevelPyramid.m_data.
                super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start._4_4_) {
      resultRGBA8.super_TextureLevelPyramid.m_data.
      super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = iVar2;
    }
    local_1d8.super_ConstPixelBufferAccess.m_size.m_data[0] =
         (int)(2.0 / (float)(1 << (bVar10 & 0x1f)));
    local_1d8.super_ConstPixelBufferAccess.m_size.m_data[1] =
         (int)(2.0 / (float)(1 << ((byte)resultRGBA8.super_TextureLevelPyramid.m_data.
                                         super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_ & 0x1f)));
    local_1d8.super_ConstPixelBufferAccess.m_format.type =
         (ChannelType)(2.0 / (float)(1 << ((byte)CVar6 & 0x1f)));
    local_1d8.super_ConstPixelBufferAccess.m_format.order =
         (ChannelOrder)(2.0 / (float)(1 << ((byte)CVar5 & 0x1f)));
    bVar7 = tcu::floatThresholdCompare
                      (log,"Result","Result",
                       &(reference.super_TextureLevelPyramid.m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess,
                       (ConstPixelBufferAccess *)&referenceRGBA8,(Vec4 *)&local_1d8,
                       COMPARE_LOG_RESULT);
    pcVar11 = "Fail";
    if (bVar7) {
      pcVar11 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar7,pcVar11);
  }
  else {
    tcu::getTextureFormatBitDepth((tcu *)&formatBitDepths,&format);
    pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar2 = (pRVar9->m_pixelFormat).redBits;
    if (iVar2 < formatBitDepths.m_data[0]) {
      formatBitDepths.m_data[0] = iVar2;
    }
    fVar13 = ceilf((2.0 / (float)(1 << ((byte)formatBitDepths.m_data[0] & 0x1f))) * 256.0);
    pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar2 = (pRVar9->m_pixelFormat).greenBits;
    if (iVar2 < formatBitDepths.m_data[1]) {
      formatBitDepths.m_data[1] = iVar2;
    }
    fVar14 = ceilf((2.0 / (float)(1 << ((byte)formatBitDepths.m_data[1] & 0x1f))) * 256.0);
    pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar2 = (pRVar9->m_pixelFormat).blueBits;
    if (iVar2 < formatBitDepths.m_data[2]) {
      formatBitDepths.m_data[2] = iVar2;
    }
    fVar15 = ceilf((2.0 / (float)(1 << ((byte)formatBitDepths.m_data[2] & 0x1f))) * 256.0);
    pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar2 = (pRVar9->m_pixelFormat).alphaBits;
    bVar10 = (byte)formatBitDepths.m_data[3];
    if (iVar2 < formatBitDepths.m_data[3]) {
      bVar10 = (byte)iVar2;
    }
    fVar16 = ceilf((2.0 / (float)(1 << (bVar10 & 0x1f))) * 256.0);
    resultRGBA8.super_TextureLevelPyramid.m_format.order = RGBA;
    resultRGBA8.super_TextureLevelPyramid.m_format.type = UNORM_INT8;
    tcu::Texture2D::Texture2D(&referenceRGBA8,(TextureFormat *)&resultRGBA8,0xd,0xd);
    local_1d8.super_ConstPixelBufferAccess.m_format.order = RGBA;
    local_1d8.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
    tcu::Texture2D::Texture2D(&resultRGBA8,(TextureFormat *)&local_1d8,0xd,0xd);
    tcu::Texture2D::allocLevel(&referenceRGBA8,0);
    tcu::Texture2D::allocLevel(&resultRGBA8,0);
    tcu::copy((EVP_PKEY_CTX *)
              referenceRGBA8.super_TextureLevelPyramid.m_access.
              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
              _M_impl.super__Vector_impl_data._M_start,
              (EVP_PKEY_CTX *)
              reference.super_TextureLevelPyramid.m_access.
              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
              _M_impl.super__Vector_impl_data._M_start);
    dst = resultRGBA8.super_TextureLevelPyramid.m_access.
          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
          _M_impl.super__Vector_impl_data._M_start;
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_1d8,&format,0xd,0xd,1,iVar12,0,
               pixelData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    tcu::copy((EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)&local_1d8);
    bVar7 = tcu::bilinearCompare
                      (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                       "Result","Result",
                       &(referenceRGBA8.super_TextureLevelPyramid.m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess,
                       &(resultRGBA8.super_TextureLevelPyramid.m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess,
                       (RGBA)(((int)fVar15 & 0xffU) << 0x10 |
                              ((int)fVar14 & 0xffU) << 8 | (int)fVar13 & 0xffU | (int)fVar16 << 0x18
                             ),COMPARE_LOG_RESULT);
    pcVar11 = "Fail";
    if (bVar7) {
      pcVar11 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar7,pcVar11);
    tcu::Texture3D::~Texture3D((Texture3D *)&resultRGBA8);
    tcu::Texture3D::~Texture3D((Texture3D *)&referenceRGBA8);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pixelData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  tcu::Texture3D::~Texture3D((Texture3D *)&reference);
  return STOP;
}

Assistant:

TestCase::IterateResult ReadPixelsTest::iterate (void)
{
	// Create reference
	const int					width	= 13;
	const int					height	= 13;

	de::Random					rnd(m_seed);

	tcu::TextureFormat			format(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8);
	int							pixelSize;
	GLint						glFormat;
	GLint						glType;

	getFormatInfo(format, glFormat, glType, pixelSize);
	m_testCtx.getLog() << tcu::TestLog::Message << "Format: " << glu::getTextureFormatStr(glFormat) << ", Type: " << glu::getTypeStr(glType) << tcu::TestLog::EndMessage;

	tcu::Texture2D reference(format, width, height);
	reference.allocLevel(0);

	GLU_CHECK_CALL(glViewport(0, 0, width, height));

	// Clear color
	{
		const float red		= rnd.getFloat();
		const float green	= rnd.getFloat();
		const float blue	= rnd.getFloat();
		const float alpha	= 1.0f;

		m_testCtx.getLog() << tcu::TestLog::Message << "Clear color: (" << red << ", " << green << ", " << blue << ", " << alpha << ")" << tcu::TestLog::EndMessage;

		// Clear target
		GLU_CHECK_CALL(glClearColor(red, green, blue, alpha));
		GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));

		tcu::clear(reference.getLevel(0), tcu::Vec4(red, green, blue, alpha));
	}

	render(reference);

	std::vector<deUint8> pixelData;
	const int rowPitch = m_alignment * deCeilFloatToInt32(float(pixelSize * width) / (float)m_alignment);

	pixelData.resize(rowPitch * height, 0);

	GLU_CHECK_CALL(glPixelStorei(GL_PACK_ALIGNMENT, m_alignment));
	GLU_CHECK_CALL(glReadPixels(0, 0, width, height, glFormat, glType, &(pixelData[0])));

	if (m_context.getRenderTarget().getNumSamples() > 1)
	{
		const tcu::IVec4	formatBitDepths	= tcu::getTextureFormatBitDepth(format);
		const deUint8		redThreshold	= (deUint8)deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().redBits,	formatBitDepths.x()))));
		const deUint8		greenThreshold	= (deUint8)deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().greenBits,	formatBitDepths.y()))));
		const deUint8		blueThreshold	= (deUint8)deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().blueBits,	formatBitDepths.z()))));
		const deUint8		alphaThreshold	= (deUint8)deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().alphaBits,	formatBitDepths.w()))));

		// bilinearCompare only accepts RGBA, UINT8
		tcu::Texture2D		referenceRGBA8	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), width, height);
		tcu::Texture2D		resultRGBA8		(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), width, height);

		referenceRGBA8.allocLevel(0);
		resultRGBA8.allocLevel(0);

		tcu::copy(referenceRGBA8.getLevel(0), reference.getLevel(0));
		tcu::copy(resultRGBA8.getLevel(0), tcu::PixelBufferAccess(format, width, height, 1, rowPitch, 0, &(pixelData[0])));

		if (tcu::bilinearCompare(m_testCtx.getLog(), "Result", "Result", referenceRGBA8.getLevel(0), resultRGBA8.getLevel(0), tcu::RGBA(redThreshold, greenThreshold, blueThreshold, alphaThreshold), tcu::COMPARE_LOG_RESULT))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		const tcu::IVec4	formatBitDepths	= tcu::getTextureFormatBitDepth(format);
		const float			redThreshold	= 2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().redBits,		formatBitDepths.x()));
		const float			greenThreshold	= 2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().greenBits,	formatBitDepths.y()));
		const float			blueThreshold	= 2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().blueBits,	formatBitDepths.z()));
		const float			alphaThreshold	= 2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().alphaBits,	formatBitDepths.w()));

		// Compare
		if (tcu::floatThresholdCompare(m_testCtx.getLog(), "Result", "Result", reference.getLevel(0), tcu::PixelBufferAccess(format, width, height, 1, rowPitch, 0, &(pixelData[0])), tcu::Vec4(redThreshold, greenThreshold, blueThreshold, alphaThreshold), tcu::COMPARE_LOG_RESULT))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}